

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

bool __thiscall chrono::ChBody::TrySleeping(ChBody *this)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  
  uVar2 = this->bflags;
  this->bflags = uVar2 & 0xffffefff;
  if ((uVar2 >> 10 & 1) == 0) {
    return false;
  }
  iVar3 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 != '\0') {
    dVar4 = ChVector<double>::LengthInf
                      (&(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos);
    if (((double)this->sleep_minspeed <= dVar4) ||
       (dVar4 = ChQuaternion<double>::LengthInf
                          (&(this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot),
       (double)this->sleep_minwvel <= dVar4 + dVar4)) {
      this->sleep_starttime = (float)(this->super_ChPhysicsItem).super_ChObj.ChTime;
    }
    else if ((double)this->sleep_time <
             (this->super_ChPhysicsItem).super_ChObj.ChTime - (double)this->sleep_starttime) {
      pbVar1 = (byte *)((long)&this->bflags + 1);
      *pbVar1 = *pbVar1 | 0x10;
      return true;
    }
  }
  return false;
}

Assistant:

void ChBody::BFlagSet(BodyFlag mask, bool state) {
    if (state)
        bflags |= mask;
    else
        bflags &= ~mask;
}